

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_queue.c
# Opt level: O3

uo_cb * uo_cb_queue_try_dequeue(void)

{
  int iVar1;
  long lVar2;
  uo_cb *puVar3;
  timespec abs_timeout;
  timespec local_28;
  
  puVar3 = (uo_cb *)0x0;
  clock_gettime(0,&local_28);
  lVar2 = (long)((double)local_28.tv_nsec + 500000000.0);
  local_28.tv_nsec = lVar2 + -1000000000;
  if (lVar2 < 1000000000) {
    local_28.tv_nsec = lVar2;
  }
  local_28.tv_sec = local_28.tv_sec + (ulong)(999999999 < lVar2);
  iVar1 = sem_timedwait((sem_t *)&cb_queue,&local_28);
  if (iVar1 == 0) {
    LOCK();
    UNLOCK();
    puVar3 = cb_queue.cbs[cb_queue.tail & 0xff];
    cb_queue.tail = cb_queue.tail + 1;
    sem_post((sem_t *)&cb_queue.enqueue_sem);
  }
  return puVar3;
}

Assistant:

uo_cb *uo_cb_queue_try_dequeue()
{
    struct timespec abs_timeout;
    clock_gettime(CLOCK_REALTIME, &abs_timeout);
    timespec_add_ms(&abs_timeout, UO_CB_QUEUE_SEM_TIMEO);

    if (sem_timedwait(&cb_queue.dequeue_sem, &abs_timeout) == 0)
    {
        size_t tail = atomic_fetch_add(&cb_queue.tail, 1);
        uo_cb *cb = cb_queue.cbs[tail % UO_CB_QUEUE_CAPACITY];

        sem_post(&cb_queue.enqueue_sem);

        return cb;
    }
    
    return NULL;
}